

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O2

optional<jbcoin::STObject> *
jbcoin::STParsedJSONDetail::parseObject
          (optional<jbcoin::STObject> *__return_storage_ptr__,string *json_name,Value *json,
          SField *inName,int depth,Value *error)

{
  atomic<int> *paVar1;
  SerializedTypeID SVar2;
  ResultOfSetTypeFromSField RVar3;
  Counter *pCVar4;
  SField *name;
  SField *inName_00;
  reference_type args;
  reference_type pSVar5;
  char cVar6;
  Value *error_00;
  ValueHolder key;
  ValueHolder local_130;
  string *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  optional<jbcoin::STObject> ret;
  STObject data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((json->field_0x8 == '\0') || (json->field_0x8 == '\a')) {
    if (depth < 0x41) {
      data.super_STBase._vptr_STBase = (_func_int **)&PTR__STBase_002f80a8;
      error_00 = error;
      data.super_STBase.fName = inName;
      pCVar4 = CountedObject<jbcoin::STObject>::getCounter();
      LOCK();
      paVar1 = &(pCVar4->super_CounterBase).m_count;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      data.super_STBase._vptr_STBase = (_func_int **)&PTR__STObject_002f8210;
      data.v_.super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      data.v_.super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      data.v_.super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      data.mType = (SOTemplate *)0x0;
      Json::Value::getMemberNames_abi_cxx11_((Members *)&local_130,json);
      key = local_130;
      do {
        if (key == local_128) {
          beast::unit_test::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_130);
          RVar3 = STObject::setTypeFromSField(&data,inName);
          if (RVar3 == typeSetFail) {
            SField::getName_abi_cxx11_((string *)&local_118,inName);
            std::operator+(&local_50,"Object \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_118);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,&local_50,"\' contents did not meet requirements for that type.");
            RPC::make_error((RPC *)&local_130.bool_,rpcINVALID_PARAMS,(string *)&ret);
            std::__cxx11::string::~string((string *)&ret);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_118);
            Json::Value::swap(error,(Value *)&local_130);
            Json::Value::~Value((Value *)&local_130);
            (__return_storage_ptr__->super_type).m_initialized = false;
          }
          else {
            boost::optional_detail::optional_base<jbcoin::STObject>::optional_base
                      (&__return_storage_ptr__->super_type,&data);
          }
LAB_001dc15a:
          STObject::~STObject(&data);
          return __return_storage_ptr__;
        }
        name = (SField *)Json::Value::operator[](json,(string *)key.map_);
        inName_00 = SField::getField((string *)key.map_);
        if (inName_00->fieldCode == sfInvalid) {
          unknown_field((STParsedJSONDetail *)&ret,json_name,(string *)key.map_);
LAB_001dc12f:
          Json::Value::swap(error,(Value *)&ret);
          Json::Value::~Value((Value *)&ret);
          (__return_storage_ptr__->super_type).m_initialized = false;
LAB_001dc150:
          beast::unit_test::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_130);
          goto LAB_001dc15a;
        }
        SVar2 = inName_00->fieldType;
        if ((uint)(SVar2 + 0xffffd8ef) < 3) {
LAB_001dbe7b:
          cVar6 = (char)name->fieldValue;
          if ((cVar6 != '\0') && (cVar6 != '\a')) {
            not_an_object((STParsedJSONDetail *)&ret,json_name,(string *)key.map_);
            goto LAB_001dc12f;
          }
          std::operator+(&local_118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         json_name,".");
          std::operator+(&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         key.map_);
          error_00 = error;
          parseObject(&ret,&local_50,(Value *)name,inName_00,depth + 1,error);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_118);
          cVar6 = ret.super_type.m_initialized;
          if (ret.super_type.m_initialized == false) {
            (__return_storage_ptr__->super_type).m_initialized = false;
          }
          else {
            args = boost::optional<jbcoin::STObject>::get(&ret);
            STObject::emplace_back<jbcoin::STObject>(&data,args);
          }
          boost::optional_detail::optional_base<jbcoin::STObject>::~optional_base(&ret.super_type);
        }
        else {
          if (SVar2 == STI_ARRAY) {
            std::operator+(&local_118,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           json_name,".");
            std::operator+(&local_50,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_118,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           key.map_);
            error_00 = error;
            parseArray((optional<jbcoin::detail::STVar> *)&ret,&local_50,(Value *)name,inName_00,
                       depth + 1,error);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_118);
            cVar6 = ret.super_type.m_initialized;
            if (ret.super_type.m_initialized == false) {
LAB_001dbfe4:
              (__return_storage_ptr__->super_type).m_initialized = false;
              cVar6 = ret.super_type.m_initialized;
            }
            else {
              pSVar5 = boost::optional<jbcoin::detail::STVar>::get
                                 ((optional<jbcoin::detail::STVar> *)&ret);
              STObject::emplace_back<jbcoin::detail::STVar>(&data,pSVar5);
            }
          }
          else {
            if (SVar2 == STI_OBJECT) goto LAB_001dbe7b;
            parseLeaf((optional<jbcoin::detail::STVar> *)&ret,json_name,(string *)key.map_,name,
                      error,error_00);
            cVar6 = ret.super_type.m_initialized;
            if (ret.super_type.m_initialized == false) goto LAB_001dbfe4;
            pSVar5 = boost::optional<jbcoin::detail::STVar>::get
                               ((optional<jbcoin::detail::STVar> *)&ret);
            STObject::emplace_back<jbcoin::detail::STVar>(&data,pSVar5);
          }
          boost::optional_detail::optional_base<jbcoin::detail::STVar>::~optional_base
                    ((optional_base<jbcoin::detail::STVar> *)&ret);
        }
        if (cVar6 == '\0') goto LAB_001dc150;
        key.string_ = (char *)&((key.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
      } while( true );
    }
    too_deep((STParsedJSONDetail *)&ret,json_name);
  }
  else {
    not_an_object((STParsedJSONDetail *)&ret,json_name);
  }
  Json::Value::swap(error,(Value *)&ret);
  Json::Value::~Value((Value *)&ret);
  (__return_storage_ptr__->super_type).m_initialized = false;
  return __return_storage_ptr__;
}

Assistant:

static boost::optional <STObject> parseObject (
    std::string const& json_name,
    Json::Value const& json,
    SField const& inName,
    int depth,
    Json::Value& error)
{
    if (! json.isObject ())
    {
        error = not_an_object (json_name);
        return boost::none;
    }

    if (depth > maxDepth)
    {
        error = too_deep (json_name);
        return boost::none;
    }

    STObject data (inName);

    for (auto const& fieldName : json.getMemberNames ())
    {
        Json::Value const& value = json [fieldName];

        auto const& field = SField::getField (fieldName);

        if (field == sfInvalid)
        {
            error = unknown_field (json_name, fieldName);
            return boost::none;
        }

        switch (field.fieldType)
        {

        // Object-style containers (which recurse).
        case STI_OBJECT:
        case STI_TRANSACTION:
        case STI_LEDGERENTRY:
        case STI_VALIDATION:
            if (! value.isObject ())
            {
                error = not_an_object (json_name, fieldName);
                return boost::none;
            }

            try
            {
                auto ret = parseObject (json_name + "." + fieldName,
                    value, field, depth + 1, error);
                if (! ret)
                    return boost::none;
                data.emplace_back (std::move (*ret));
            }
            catch (std::exception const&)
            {
                error = invalid_data (json_name, fieldName);
                return boost::none;
            }

            break;

        // Array-style containers (which recurse).
        case STI_ARRAY:
            try
            {
                auto array = parseArray (json_name + "." + fieldName,
                    value, field, depth + 1, error);
                if (array == boost::none)
                    return boost::none;
                data.emplace_back (std::move (*array));
            }
            catch (std::exception const&)
            {
                error = invalid_data (json_name, fieldName);
                return boost::none;
            }

            break;

        // Everything else (types that don't recurse).
        default:
            {
                auto leaf =
                    parseLeaf (json_name, fieldName, &inName, value, error);

                if (!leaf)
                    return boost::none;

                data.emplace_back (std::move (*leaf));
            }

            break;
        }
    }

    // Some inner object types have templates.  Attempt to apply that.
    if (data.setTypeFromSField (inName) == STObject::typeSetFail)
    {
        error = template_mismatch (inName);
        return boost::none;
    }

    return std::move (data);
}